

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

void __thiscall Centaurus::Context<char>::Context(Context<char> *this,char *filename)

{
  value_type local_28;
  
  Grammar<char>::Grammar(&this->m_grammar);
  ParserEM64T<char>::ParserEM64T(&this->m_parser);
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Grammar<char>::parse(&this->m_grammar,filename,1);
  ParserEM64T<char>::init(&this->m_parser,(EVP_PKEY_CTX *)this);
  local_28 = (value_type)0x0;
  std::
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ::resize(&this->m_callbacks,(long)((int)(this->m_grammar).m_networks._M_h._M_element_count + 1),
           &local_28);
  return;
}

Assistant:

Context(const char *filename)
    {
        /*std::wifstream grammar_file(filename, std::ios::in);

        std::wstring wide_grammar(std::istreambuf_iterator<wchar_t>(grammar_file), {});

        Stream stream(std::move(wide_grammar));*/

        m_grammar.parse(filename);

        m_parser.init(m_grammar);

        m_callbacks.resize(m_grammar.get_machine_num() + 1, nullptr);
    }